

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O1

void __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::iStack
          (iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> *this,int *size)

{
  long lVar1;
  undefined8 in_RAX;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined8 uStack_38;
  
  lVar4 = (long)*size;
  this->_size = *size;
  this->_top = -1;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar3 = lVar4 * 0x10 + 8;
  }
  uStack_38 = in_RAX;
  plVar2 = (long *)operator_new__(uVar3);
  *plVar2 = lVar4;
  if (lVar4 != 0) {
    lVar5 = 8;
    do {
      uStack_38 = CONCAT44(0x400,(undefined4)uStack_38);
      iStack<Imaginer::Utils::iRpn::RPNnode>::iStack
                ((iStack<Imaginer::Utils::iRpn::RPNnode> *)((long)plVar2 + lVar5),
                 (int *)((long)&uStack_38 + 4));
      lVar1 = lVar5 + lVar4 * -0x10;
      lVar5 = lVar5 + 0x10;
    } while (lVar1 != -8);
  }
  this->_data = (iStack<Imaginer::Utils::iRpn::RPNnode> *)(plVar2 + 1);
  return;
}

Assistant:

iStack(const int& size = 1024):_size(size),_top(-1)
    {
        _data = new Type[_size];
    }